

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

uint GetBlockScriptFlags(CBlockIndex *block_index,ChainstateManager *chainman)

{
  bool bVar1;
  Params *pPVar2;
  pointer ppVar3;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint32_t flags;
  Params *consensusparams;
  const_iterator it;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  BuriedDeployment in_stack_ffffffffffffffbe;
  ChainstateManager *chainman_00;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  undefined8 in_stack_ffffffffffffffe8;
  int line;
  char *in_stack_fffffffffffffff0;
  uint256 **val;
  
  line = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  val = *(uint256 ***)(in_FS_OFFSET + 0x28);
  pPVar2 = ChainstateManager::GetConsensus
                     ((ChainstateManager *)
                      CONCAT26(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
  uVar4 = 0x20801;
  chainman_00 = (ChainstateManager *)&pPVar2->script_flag_exceptions;
  inline_assertion_check<true,uint256_const*const&>
            (val,in_stack_fffffffffffffff0,line,in_RDI,in_RSI);
  std::
  map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::find((map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
          *)chainman_00,
         (key_type *)
         CONCAT26(in_stack_ffffffffffffffbe,
                  CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
  std::
  map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::end((map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
         *)chainman_00);
  bVar1 = std::operator==((_Self *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),(_Self *)chainman_00);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_unsigned_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_uint256,_unsigned_int>_> *)
                        CONCAT26(in_stack_ffffffffffffffbe,
                                 CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
    uVar4 = ppVar3->second;
  }
  bVar1 = DeploymentActiveAt<Consensus::BuriedDeployment>
                    ((CBlockIndex *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),chainman_00,
                     in_stack_ffffffffffffffbe);
  if (bVar1) {
    uVar4 = uVar4 | 4;
  }
  bVar1 = DeploymentActiveAt<Consensus::BuriedDeployment>
                    ((CBlockIndex *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),chainman_00,
                     in_stack_ffffffffffffffbe);
  if (bVar1) {
    uVar4 = uVar4 | 0x200;
  }
  bVar1 = DeploymentActiveAt<Consensus::BuriedDeployment>
                    ((CBlockIndex *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),chainman_00,
                     in_stack_ffffffffffffffbe);
  if (bVar1) {
    uVar4 = uVar4 | 0x400;
  }
  bVar1 = DeploymentActiveAt<Consensus::BuriedDeployment>
                    ((CBlockIndex *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),chainman_00,
                     in_stack_ffffffffffffffbe);
  if (bVar1) {
    uVar4 = uVar4 | 0x10;
  }
  if (*(uint256 ***)(in_FS_OFFSET + 0x28) != val) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

static unsigned int GetBlockScriptFlags(const CBlockIndex& block_index, const ChainstateManager& chainman)
{
    const Consensus::Params& consensusparams = chainman.GetConsensus();

    // BIP16 didn't become active until Apr 1 2012 (on mainnet, and
    // retroactively applied to testnet)
    // However, only one historical block violated the P2SH rules (on both
    // mainnet and testnet).
    // Similarly, only one historical block violated the TAPROOT rules on
    // mainnet.
    // For simplicity, always leave P2SH+WITNESS+TAPROOT on except for the two
    // violating blocks.
    uint32_t flags{SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_TAPROOT};
    const auto it{consensusparams.script_flag_exceptions.find(*Assert(block_index.phashBlock))};
    if (it != consensusparams.script_flag_exceptions.end()) {
        flags = it->second;
    }

    // Enforce the DERSIG (BIP66) rule
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_DERSIG)) {
        flags |= SCRIPT_VERIFY_DERSIG;
    }

    // Enforce CHECKLOCKTIMEVERIFY (BIP65)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_CLTV)) {
        flags |= SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY;
    }

    // Enforce CHECKSEQUENCEVERIFY (BIP112)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_CSV)) {
        flags |= SCRIPT_VERIFY_CHECKSEQUENCEVERIFY;
    }

    // Enforce BIP147 NULLDUMMY (activated simultaneously with segwit)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_SEGWIT)) {
        flags |= SCRIPT_VERIFY_NULLDUMMY;
    }

    return flags;
}